

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

Try<std::error_code> * __thiscall
async_simple::coro::detail::LazyPromise<std::error_code>::tryResult
          (LazyPromise<std::error_code> *this)

{
  bool bVar1;
  error_code *value;
  Try<std::error_code> *in_RDI;
  exception_ptr *in_stack_ffffffffffffffb8;
  Try<std::error_code> *in_stack_ffffffffffffffc0;
  Try<std::error_code> *this_00;
  Try<std::error_code> local_18;
  
  bVar1 = std::
          holds_alternative<std::__exception_ptr::exception_ptr,std::monostate,std::error_code,std::__exception_ptr::exception_ptr>
                    ((variant<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
                      *)0x1ab16e);
  if (bVar1) {
    std::
    get<std::__exception_ptr::exception_ptr,std::monostate,std::error_code,std::__exception_ptr::exception_ptr>
              ((variant<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr> *)
               0x1ab182);
    this_00 = &local_18;
    std::__exception_ptr::exception_ptr::exception_ptr
              ((exception_ptr *)this_00,in_stack_ffffffffffffffb8);
    Try<std::error_code>::Try(this_00,in_stack_ffffffffffffffb8);
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)this_00);
  }
  else {
    value = std::
            get<std::error_code,std::monostate,std::error_code,std::__exception_ptr::exception_ptr>
                      ((variant<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
                        *)0x1ab1c8);
    Try<std::error_code>::Try<std::error_code>(in_stack_ffffffffffffffc0,value);
  }
  return in_RDI;
}

Assistant:

Try<T> tryResult() noexcept {
        if (std::holds_alternative<std::exception_ptr>(_value))
            AS_UNLIKELY { return Try<T>(std::get<std::exception_ptr>(_value)); }